

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O2

al_fixed al_fixhypot(al_fixed x,al_fixed y)

{
  al_fixed aVar1;
  float fVar2;
  
  fVar2 = hypotf((float)x * 1.5258789e-05,(float)y * 1.5258789e-05);
  aVar1 = al_ftofix((double)fVar2);
  return aVar1;
}

Assistant:

al_fixed al_fixhypot(al_fixed x, al_fixed y)
{
   return al_ftofix(hypotf(al_fixtof(x), al_fixtof(y)));
}